

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.h
# Opt level: O3

uint64_t avx512_vpopcount(__m512i *data,uint64_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  __m512i *palVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  
  palVar4 = data + 3;
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  uVar3 = 0xfffffffffffffffc;
  do {
    auVar6 = vpopcntq_avx512_vpopcntdq((undefined1  [64])palVar4[-3]);
    auVar8 = vpaddq_avx512f(auVar6,auVar8);
    auVar6 = vpopcntq_avx512_vpopcntdq((undefined1  [64])palVar4[-2]);
    auVar7 = vpopcntq_avx512_vpopcntdq((undefined1  [64])palVar4[-1]);
    auVar6 = vpaddq_avx512f(auVar6,auVar7);
    auVar8 = vpaddq_avx512f(auVar8,auVar6);
    auVar6 = vpopcntq_avx512_vpopcntdq((undefined1  [64])*palVar4);
    auVar8 = vpaddq_avx512f(auVar8,auVar6);
    uVar3 = uVar3 + 4;
    palVar4 = palVar4 + 4;
  } while (uVar3 < 0x7c);
  auVar5 = vextracti64x4_avx512f(auVar8,1);
  auVar8 = vpaddq_avx512f(auVar8,ZEXT3264(auVar5));
  auVar1 = vpaddq_avx(auVar8._0_16_,auVar8._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddq_avx(auVar1,auVar2);
  return auVar1._0_8_;
}

Assistant:

static inline uint64_t avx512_vpopcount(const __m512i *data,
                                        const uint64_t size) {
    const uint64_t limit = size - size % 4;
    __m512i total = _mm512_setzero_si512();
    uint64_t i = 0;

    for (; i < limit; i += 4) {
        VPOPCNT_AND_ADD(data + i, 0, total);
        VPOPCNT_AND_ADD(data + i, 1, total);
        VPOPCNT_AND_ADD(data + i, 2, total);
        VPOPCNT_AND_ADD(data + i, 3, total);
    }

    for (; i < size; i++) {
        total = _mm512_add_epi64(
            total, _mm512_popcnt_epi64(_mm512_loadu_si512(data + i)));
    }

    return simd_sum_epu64(total);
}